

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_exp>(Mat *a,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [48];
  undefined1 auVar64 [24];
  undefined1 auVar65 [40];
  undefined1 auVar66 [56];
  long *in_RDI;
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar71;
  float fVar72;
  undefined1 auVar70 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_exp op;
  Mat *m;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  undefined8 local_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  int local_1e3c;
  undefined8 local_1e38;
  undefined8 local_1e30;
  undefined8 local_1e28;
  undefined4 local_1e20;
  long local_1e18;
  undefined4 local_1e10;
  undefined4 local_1e0c;
  undefined4 local_1e08;
  undefined4 local_1e04;
  undefined4 local_1e00;
  undefined8 local_1df8;
  undefined1 (*local_1df0) [64];
  int local_1de8;
  int local_1de4;
  int local_1de0;
  int local_1ddc;
  int local_1dd8;
  int local_1dd4;
  int local_1dd0;
  undefined1 local_1dc9 [9];
  long *local_1dc0;
  undefined1 local_1db5;
  int local_1db4;
  undefined8 *local_1da8;
  undefined8 *local_1da0;
  undefined8 *local_1d90;
  undefined1 (*local_1d88) [64];
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined1 (*local_1d10) [64];
  undefined1 (*local_1d08) [64];
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined1 (*local_1ce0) [64];
  undefined1 (*local_1cd8) [64];
  undefined8 local_1cd0;
  undefined8 uStack_1cc8;
  undefined1 (*local_1cc0) [64];
  long local_1cb8;
  undefined4 local_1cac;
  long local_1ca8;
  undefined1 (*local_1ca0) [64];
  undefined4 local_1c94;
  int local_1c90;
  int local_1c8c;
  undefined8 *local_1c88;
  undefined4 local_1c7c;
  long local_1c78;
  undefined8 *local_1c68;
  undefined8 *local_1c40;
  undefined1 *local_1c38;
  undefined8 *local_1c30;
  undefined1 *local_1c28;
  undefined8 *local_1c20;
  undefined1 *local_1c18;
  undefined1 (*local_1c10) [64];
  undefined1 *local_1c08;
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [8];
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 uStack_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  ushort local_1b42;
  float local_1b40 [2];
  float afStack_1b38 [2];
  float afStack_1b30 [2];
  float afStack_1b28 [2];
  float afStack_1b20 [2];
  float afStack_1b18 [2];
  float afStack_1b10 [2];
  float afStack_1b08 [2];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [16];
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined1 local_1a80 [64];
  undefined1 local_1a40 [64];
  undefined1 local_1a00 [64];
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined1 local_1940 [64];
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  float local_1880 [2];
  float afStack_1878 [2];
  float afStack_1870 [2];
  float afStack_1868 [2];
  float afStack_1860 [2];
  float afStack_1858 [2];
  float afStack_1850 [2];
  float afStack_1848 [2];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  float local_1800 [2];
  float afStack_17f8 [2];
  float afStack_17f0 [2];
  float afStack_17e8 [2];
  float afStack_17e0 [2];
  float afStack_17d8 [2];
  float afStack_17d0 [2];
  float afStack_17c8 [2];
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  float local_16c0 [2];
  float afStack_16b8 [2];
  float afStack_16b0 [2];
  float afStack_16a8 [2];
  float afStack_16a0 [2];
  float afStack_1698 [2];
  float afStack_1690 [2];
  float afStack_1688 [2];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  float local_1600 [2];
  float afStack_15f8 [2];
  float afStack_15f0 [2];
  float afStack_15e8 [2];
  float afStack_15e0 [2];
  float afStack_15d8 [2];
  float afStack_15d0 [2];
  float afStack_15c8 [2];
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  float local_1540 [2];
  float afStack_1538 [2];
  float afStack_1530 [2];
  float afStack_1528 [2];
  float afStack_1520 [2];
  float afStack_1518 [2];
  float afStack_1510 [2];
  float afStack_1508 [2];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  float local_1480 [2];
  float afStack_1478 [2];
  float afStack_1470 [2];
  float afStack_1468 [2];
  float afStack_1460 [2];
  float afStack_1458 [2];
  float afStack_1450 [2];
  float afStack_1448 [2];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0 [2];
  float afStack_13b8 [2];
  float afStack_13b0 [2];
  float afStack_13a8 [2];
  float afStack_13a0 [2];
  float afStack_1398 [2];
  float afStack_1390 [2];
  float afStack_1388 [2];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340 [2];
  float afStack_1338 [2];
  float afStack_1330 [2];
  float afStack_1328 [2];
  float afStack_1320 [2];
  float afStack_1318 [2];
  float afStack_1310 [2];
  float afStack_1308 [2];
  float local_1300 [2];
  float afStack_12f8 [2];
  float afStack_12f0 [2];
  float afStack_12e8 [2];
  float afStack_12e0 [2];
  float afStack_12d8 [2];
  float afStack_12d0 [2];
  float afStack_12c8 [2];
  float local_12c0 [2];
  float afStack_12b8 [2];
  float afStack_12b0 [2];
  float afStack_12a8 [2];
  float afStack_12a0 [2];
  float afStack_1298 [2];
  float afStack_1290 [2];
  float afStack_1288 [2];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  float local_1240 [2];
  float afStack_1238 [2];
  float afStack_1230 [2];
  float afStack_1228 [2];
  float afStack_1220 [2];
  float afStack_1218 [2];
  float afStack_1210 [2];
  float afStack_1208 [2];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  ushort local_1182;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float local_1140 [2];
  float afStack_1138 [2];
  float afStack_1130 [2];
  float afStack_1128 [2];
  float afStack_1120 [2];
  float afStack_1118 [2];
  float afStack_1110 [2];
  float afStack_1108 [2];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  float local_1080 [2];
  float afStack_1078 [2];
  float afStack_1070 [2];
  float afStack_1068 [2];
  float afStack_1060 [2];
  float afStack_1058 [2];
  float afStack_1050 [2];
  float afStack_1048 [2];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0 [2];
  float afStack_fb8 [2];
  float afStack_fb0 [2];
  float afStack_fa8 [2];
  float afStack_fa0 [2];
  float afStack_f98 [2];
  float afStack_f90 [2];
  float afStack_f88 [2];
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  float local_f40 [2];
  float afStack_f38 [2];
  float afStack_f30 [2];
  float afStack_f28 [2];
  float afStack_f20 [2];
  float afStack_f18 [2];
  float afStack_f10 [2];
  float afStack_f08 [2];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined4 local_dc4;
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [8];
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [32];
  undefined4 local_ce0;
  undefined4 uStack_cdc;
  undefined4 uStack_cd8;
  undefined4 uStack_cd4;
  undefined4 uStack_cd0;
  undefined4 uStack_ccc;
  undefined4 uStack_cc8;
  undefined4 uStack_cc4;
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [8];
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined1 local_c60 [32];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined4 local_b00;
  undefined4 uStack_afc;
  undefined4 uStack_af8;
  undefined4 uStack_af4;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  undefined4 uStack_ae8;
  undefined4 uStack_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined4 local_ac0;
  undefined4 uStack_abc;
  undefined4 uStack_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 uStack_aa8;
  undefined4 uStack_aa4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 *local_a78;
  undefined1 *local_a70;
  undefined1 *local_a68;
  float *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  float *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  float *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  float *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  float *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  float *local_9e8;
  float *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  float *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  float *local_9b0;
  undefined1 *local_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined4 local_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  float local_8c0 [2];
  float afStack_8b8 [2];
  float afStack_8b0 [2];
  float afStack_8a8 [2];
  float local_8a0 [2];
  float afStack_898 [2];
  float afStack_890 [2];
  float afStack_888 [2];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860 [2];
  float afStack_858 [2];
  float afStack_850 [2];
  float afStack_848 [2];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  float local_800 [2];
  float afStack_7f8 [2];
  float afStack_7f0 [2];
  float afStack_7e8 [2];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0 [2];
  float afStack_798 [2];
  float afStack_790 [2];
  float afStack_788 [2];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  float local_740 [2];
  float afStack_738 [2];
  float afStack_730 [2];
  float afStack_728 [2];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0 [2];
  float afStack_6d8 [2];
  float afStack_6d0 [2];
  float afStack_6c8 [2];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600 [2];
  float afStack_5f8 [2];
  float afStack_5f0 [2];
  float afStack_5e8 [2];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0 [2];
  float afStack_598 [2];
  float afStack_590 [2];
  float afStack_588 [2];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined4 local_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined1 local_4d0 [8];
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined4 local_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined1 local_4a0 [16];
  undefined1 local_490 [8];
  undefined8 uStack_488;
  undefined1 local_480 [8];
  undefined8 uStack_478;
  undefined1 local_470 [16];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410 [16];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined4 local_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  undefined4 uStack_334;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 *local_2d0;
  float *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  float *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  float *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  float *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  float *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  float *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  float *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined4 local_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0 [2];
  float afStack_1b8 [2];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190 [2];
  float afStack_188 [2];
  undefined8 local_180;
  undefined8 uStack_178;
  float local_170 [2];
  float afStack_168 [2];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140 [2];
  float afStack_138 [2];
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  float local_110 [2];
  float afStack_108 [2];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  float local_b0 [2];
  float afStack_a8 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_1dd0 = *(int *)((long)in_RDI + 0x2c);
  local_1dd4 = (int)in_RDI[6];
  local_1dd8 = *(int *)((long)in_RDI + 0x34);
  local_1ddc = (int)in_RDI[7];
  local_1de0 = (int)in_RDI[3];
  local_1de4 = local_1dd0 * local_1dd4 * local_1dd8 * local_1de0;
  local_1dc0 = in_RDI;
  for (local_1de8 = 0; local_1de8 < local_1ddc; local_1de8 = local_1de8 + 1) {
    local_1da8 = &local_1e38;
    local_1c8c = *(int *)((long)local_1dc0 + 0x2c);
    local_1c90 = (int)local_1dc0[6];
    local_1c94 = *(undefined4 *)((long)local_1dc0 + 0x34);
    local_1ca0 = (undefined1 (*) [64])
                 (*local_1dc0 + local_1dc0[8] * (long)local_1de8 * local_1dc0[2]);
    local_1ca8 = local_1dc0[2];
    local_1cac = (undefined4)local_1dc0[3];
    local_1cb8 = local_1dc0[4];
    local_1c88 = &local_1e38;
    local_1c78 = (long)local_1c8c * (long)local_1c90 * local_1ca8;
    local_1da0 = &local_1e38;
    local_1d90 = &local_1e38;
    local_1c7c = 0x10;
    local_1db4 = local_1de8;
    local_1db5 = 1;
    local_1e38 = 0;
    local_1e28 = 0;
    local_1e20 = 0;
    local_1e10 = 0;
    local_1e0c = 0;
    local_1e08 = 0;
    local_1e04 = 0;
    local_1e00 = 0;
    local_1df8 = 0;
    local_1e30 = 0;
    local_1df0 = local_1ca0;
    for (local_1e3c = 0; local_1e3c + 0xf < local_1de4; local_1e3c = local_1e3c + 0x10) {
      local_1d88 = local_1df0;
      auVar63 = *(undefined1 (*) [48])*local_1df0;
      uStack_1810 = *(undefined8 *)(*local_1df0 + 0x30);
      uStack_1808 = *(undefined8 *)(*local_1df0 + 0x38);
      local_1c38 = local_1dc9;
      local_1c40 = &local_1e80;
      local_19c0 = 0;
      uStack_19b8 = 0;
      uStack_19b0 = 0;
      uStack_19a8 = 0;
      uStack_19a0 = 0;
      uStack_1998 = 0;
      uStack_1990 = 0;
      uStack_1988 = 0;
      local_1b40[0] = 1.0;
      local_1b40[1] = 1.0;
      afStack_1b38[0] = 1.0;
      afStack_1b38[1] = 1.0;
      afStack_1b30[0] = 1.0;
      afStack_1b30[1] = 1.0;
      afStack_1b28[0] = 1.0;
      afStack_1b28[1] = 1.0;
      afStack_1b20[0] = 1.0;
      afStack_1b20[1] = 1.0;
      afStack_1b18[0] = 1.0;
      afStack_1b18[1] = 1.0;
      afStack_1b10[0] = 1.0;
      afStack_1b10[1] = 1.0;
      afStack_1b08[0] = 1.0;
      afStack_1b08[1] = 1.0;
      local_1a40._0_8_ = auVar63._0_8_;
      local_1840 = local_1a40._0_8_;
      local_1a40._8_8_ = auVar63._8_8_;
      uStack_1838 = local_1a40._8_8_;
      local_1a40._16_8_ = auVar63._16_8_;
      uStack_1830 = local_1a40._16_8_;
      local_1a40._24_8_ = auVar63._24_8_;
      uStack_1828 = local_1a40._24_8_;
      local_1a40._32_8_ = auVar63._32_8_;
      uStack_1820 = local_1a40._32_8_;
      local_1a40._40_8_ = auVar63._40_8_;
      uStack_1818 = local_1a40._40_8_;
      local_1880[0] = 88.37626;
      local_1880[1] = 88.37626;
      afStack_1878[0] = 88.37626;
      afStack_1878[1] = 88.37626;
      afStack_1870[0] = 88.37626;
      afStack_1870[1] = 88.37626;
      afStack_1868[0] = 88.37626;
      afStack_1868[1] = 88.37626;
      afStack_1860[0] = 88.37626;
      afStack_1860[1] = 88.37626;
      afStack_1858[0] = 88.37626;
      afStack_1858[1] = 88.37626;
      afStack_1850[0] = 88.37626;
      afStack_1850[1] = 88.37626;
      afStack_1848[0] = 88.37626;
      afStack_1848[1] = 88.37626;
      auVar67._8_4_ = 88.37626;
      auVar67._12_4_ = 88.37626;
      auVar67._0_4_ = 88.37626;
      auVar67._4_4_ = 88.37626;
      auVar67._16_4_ = 88.37626;
      auVar67._20_4_ = 88.37626;
      auVar67._24_4_ = 88.37626;
      auVar67._28_4_ = 88.37626;
      auVar67._32_4_ = 88.37626;
      auVar67._36_4_ = 88.37626;
      auVar67._40_4_ = 88.37626;
      auVar67._44_4_ = 88.37626;
      auVar67._48_4_ = 88.37626;
      auVar67._52_4_ = 88.37626;
      auVar67._56_4_ = 88.37626;
      auVar67._60_4_ = 88.37626;
      auVar67 = vminps_avx512f(*local_1df0,auVar67);
      local_1a40._0_8_ = auVar67._0_8_;
      local_17c0 = local_1a40._0_8_;
      local_1a40._8_8_ = auVar67._8_8_;
      uStack_17b8 = local_1a40._8_8_;
      local_1a40._16_8_ = auVar67._16_8_;
      uStack_17b0 = local_1a40._16_8_;
      local_1a40._24_8_ = auVar67._24_8_;
      uStack_17a8 = local_1a40._24_8_;
      local_1a40._32_8_ = auVar67._32_8_;
      uStack_17a0 = local_1a40._32_8_;
      local_1a40._40_8_ = auVar67._40_8_;
      uStack_1798 = local_1a40._40_8_;
      local_1a40._48_8_ = auVar67._48_8_;
      uStack_1790 = local_1a40._48_8_;
      local_1a40._56_8_ = auVar67._56_8_;
      uStack_1788 = local_1a40._56_8_;
      local_1800[0] = -88.37626;
      local_1800[1] = -88.37626;
      afStack_17f8[0] = -88.37626;
      afStack_17f8[1] = -88.37626;
      afStack_17f0[0] = -88.37626;
      afStack_17f0[1] = -88.37626;
      afStack_17e8[0] = -88.37626;
      afStack_17e8[1] = -88.37626;
      afStack_17e0[0] = -88.37626;
      afStack_17e0[1] = -88.37626;
      afStack_17d8[0] = -88.37626;
      afStack_17d8[1] = -88.37626;
      afStack_17d0[0] = -88.37626;
      afStack_17d0[1] = -88.37626;
      afStack_17c8[0] = -88.37626;
      afStack_17c8[1] = -88.37626;
      auVar68._8_4_ = -88.37626;
      auVar68._12_4_ = -88.37626;
      auVar68._0_4_ = -88.37626;
      auVar68._4_4_ = -88.37626;
      auVar68._16_4_ = -88.37626;
      auVar68._20_4_ = -88.37626;
      auVar68._24_4_ = -88.37626;
      auVar68._28_4_ = -88.37626;
      auVar68._32_4_ = -88.37626;
      auVar68._36_4_ = -88.37626;
      auVar68._40_4_ = -88.37626;
      auVar68._44_4_ = -88.37626;
      auVar68._48_4_ = -88.37626;
      auVar68._52_4_ = -88.37626;
      auVar68._56_4_ = -88.37626;
      auVar68._60_4_ = -88.37626;
      auVar67 = vmaxps_avx512f(auVar67,auVar68);
      local_1a40._0_8_ = auVar67._0_8_;
      local_1280 = local_1a40._0_8_;
      local_1a40._8_8_ = auVar67._8_8_;
      uStack_1278 = local_1a40._8_8_;
      local_1a40._16_8_ = auVar67._16_8_;
      uStack_1270 = local_1a40._16_8_;
      local_1a40._24_8_ = auVar67._24_8_;
      uStack_1268 = local_1a40._24_8_;
      local_1a40._32_8_ = auVar67._32_8_;
      uStack_1260 = local_1a40._32_8_;
      local_1a40._40_8_ = auVar67._40_8_;
      uStack_1258 = local_1a40._40_8_;
      local_1a40._48_8_ = auVar67._48_8_;
      uStack_1250 = local_1a40._48_8_;
      local_1a40._56_8_ = auVar67._56_8_;
      uStack_1248 = local_1a40._56_8_;
      local_12c0[0] = 1.442695;
      local_12c0[1] = 1.442695;
      afStack_12b8[0] = 1.442695;
      afStack_12b8[1] = 1.442695;
      afStack_12b0[0] = 1.442695;
      afStack_12b0[1] = 1.442695;
      afStack_12a8[0] = 1.442695;
      afStack_12a8[1] = 1.442695;
      afStack_12a0[0] = 1.442695;
      afStack_12a0[1] = 1.442695;
      afStack_1298[0] = 1.442695;
      afStack_1298[1] = 1.442695;
      afStack_1290[0] = 1.442695;
      afStack_1290[1] = 1.442695;
      afStack_1288[0] = 1.442695;
      afStack_1288[1] = 1.442695;
      local_1300[0] = 0.5;
      local_1300[1] = 0.5;
      afStack_12f8[0] = 0.5;
      afStack_12f8[1] = 0.5;
      afStack_12f0[0] = 0.5;
      afStack_12f0[1] = 0.5;
      afStack_12e8[0] = 0.5;
      afStack_12e8[1] = 0.5;
      afStack_12e0[0] = 0.5;
      afStack_12e0[1] = 0.5;
      afStack_12d8[0] = 0.5;
      afStack_12d8[1] = 0.5;
      afStack_12d0[0] = 0.5;
      afStack_12d0[1] = 0.5;
      afStack_12c8[0] = 0.5;
      afStack_12c8[1] = 0.5;
      auVar32._8_4_ = 1.442695;
      auVar32._12_4_ = 1.442695;
      auVar32._0_4_ = 1.442695;
      auVar32._4_4_ = 1.442695;
      auVar32._16_4_ = 1.442695;
      auVar32._20_4_ = 1.442695;
      auVar32._24_4_ = 1.442695;
      auVar32._28_4_ = 1.442695;
      auVar32._32_4_ = 1.442695;
      auVar32._36_4_ = 1.442695;
      auVar32._40_4_ = 1.442695;
      auVar32._44_4_ = 1.442695;
      auVar32._48_4_ = 1.442695;
      auVar32._52_4_ = 1.442695;
      auVar32._56_4_ = 1.442695;
      auVar32._60_4_ = 1.442695;
      auVar31._8_4_ = 0.5;
      auVar31._12_4_ = 0.5;
      auVar31._0_4_ = 0.5;
      auVar31._4_4_ = 0.5;
      auVar31._16_4_ = 0.5;
      auVar31._20_4_ = 0.5;
      auVar31._24_4_ = 0.5;
      auVar31._28_4_ = 0.5;
      auVar31._32_4_ = 0.5;
      auVar31._36_4_ = 0.5;
      auVar31._40_4_ = 0.5;
      auVar31._44_4_ = 0.5;
      auVar31._48_4_ = 0.5;
      auVar31._52_4_ = 0.5;
      auVar31._56_4_ = 0.5;
      auVar31._60_4_ = 0.5;
      auVar68 = vfmadd213ps_avx512f(auVar32,auVar67,auVar31);
      auVar69 = vrndscaleps_avx512f(auVar68,1);
      uVar21 = vcmpps_avx512f(auVar68,auVar69,1);
      local_1b42 = (ushort)uVar21;
      local_1a80._0_8_ = auVar69._0_8_;
      local_1200 = local_1a80._0_8_;
      local_1a80._8_8_ = auVar69._8_8_;
      uStack_11f8 = local_1a80._8_8_;
      local_1a80._16_8_ = auVar69._16_8_;
      uStack_11f0 = local_1a80._16_8_;
      local_1a80._24_8_ = auVar69._24_8_;
      uStack_11e8 = local_1a80._24_8_;
      local_1a80._32_8_ = auVar69._32_8_;
      uStack_11e0 = local_1a80._32_8_;
      local_1a80._40_8_ = auVar69._40_8_;
      uStack_11d8 = local_1a80._40_8_;
      local_1a80._48_8_ = auVar69._48_8_;
      uStack_11d0 = local_1a80._48_8_;
      local_1a80._56_8_ = auVar69._56_8_;
      uStack_11c8 = local_1a80._56_8_;
      local_1240[0] = 1.0;
      local_1240[1] = 1.0;
      afStack_1238[0] = 1.0;
      afStack_1238[1] = 1.0;
      afStack_1230[0] = 1.0;
      afStack_1230[1] = 1.0;
      afStack_1228[0] = 1.0;
      afStack_1228[1] = 1.0;
      afStack_1220[0] = 1.0;
      afStack_1220[1] = 1.0;
      afStack_1218[0] = 1.0;
      afStack_1218[1] = 1.0;
      afStack_1210[0] = 1.0;
      afStack_1210[1] = 1.0;
      afStack_1208[0] = 1.0;
      afStack_1208[1] = 1.0;
      local_1100 = local_1a80._0_8_;
      uStack_10f8 = local_1a80._8_8_;
      uStack_10f0 = local_1a80._16_8_;
      uStack_10e8 = local_1a80._24_8_;
      uStack_10e0 = local_1a80._32_8_;
      uStack_10d8 = local_1a80._40_8_;
      uStack_10d0 = local_1a80._48_8_;
      uStack_10c8 = local_1a80._56_8_;
      local_1140[0] = 1.0;
      local_1140[1] = 1.0;
      afStack_1138[0] = 1.0;
      afStack_1138[1] = 1.0;
      afStack_1130[0] = 1.0;
      afStack_1130[1] = 1.0;
      afStack_1128[0] = 1.0;
      afStack_1128[1] = 1.0;
      afStack_1120[0] = 1.0;
      afStack_1120[1] = 1.0;
      afStack_1118[0] = 1.0;
      afStack_1118[1] = 1.0;
      afStack_1110[0] = 1.0;
      afStack_1110[1] = 1.0;
      afStack_1108[0] = 1.0;
      afStack_1108[1] = 1.0;
      auVar33._8_4_ = 1.0;
      auVar33._12_4_ = 1.0;
      auVar33._0_4_ = 1.0;
      auVar33._4_4_ = 1.0;
      auVar33._16_4_ = 1.0;
      auVar33._20_4_ = 1.0;
      auVar33._24_4_ = 1.0;
      auVar33._28_4_ = 1.0;
      auVar33._32_4_ = 1.0;
      auVar33._36_4_ = 1.0;
      auVar33._40_4_ = 1.0;
      auVar33._44_4_ = 1.0;
      auVar33._48_4_ = 1.0;
      auVar33._52_4_ = 1.0;
      auVar33._56_4_ = 1.0;
      auVar33._60_4_ = 1.0;
      local_1180._0_4_ = auVar69._0_4_;
      local_1180._4_4_ = auVar69._4_4_;
      uStack_1178._0_4_ = auVar69._8_4_;
      uStack_1178._4_4_ = auVar69._12_4_;
      uStack_1170._0_4_ = auVar69._16_4_;
      uStack_1170._4_4_ = auVar69._20_4_;
      uStack_1168._0_4_ = auVar69._24_4_;
      uStack_1168._4_4_ = auVar69._28_4_;
      uStack_1160._0_4_ = auVar69._32_4_;
      uStack_1160._4_4_ = auVar69._36_4_;
      uStack_1158._0_4_ = auVar69._40_4_;
      uStack_1158._4_4_ = auVar69._44_4_;
      uStack_1150._0_4_ = auVar69._48_4_;
      uStack_1150._4_4_ = auVar69._52_4_;
      uStack_1148._0_4_ = auVar69._56_4_;
      uStack_1148._4_4_ = auVar69._60_4_;
      auVar68 = vsubps_avx512f(auVar69,auVar33);
      bVar1 = (bool)((byte)uVar21 & 1);
      bVar2 = (bool)((byte)(local_1b42 >> 1) & 1);
      bVar3 = (bool)((byte)(local_1b42 >> 2) & 1);
      bVar4 = (bool)((byte)(local_1b42 >> 3) & 1);
      bVar5 = (bool)((byte)(local_1b42 >> 4) & 1);
      bVar6 = (bool)((byte)(local_1b42 >> 5) & 1);
      bVar7 = (bool)((byte)(local_1b42 >> 6) & 1);
      bVar8 = (bool)((byte)(local_1b42 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar21 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_1ac0._4_4_ = (uint)bVar2 * auVar68._4_4_ | (uint)!bVar2 * local_1180._4_4_;
      local_1ac0._0_4_ = (uint)bVar1 * auVar68._0_4_ | (uint)!bVar1 * (int)local_1180;
      local_1ac0._8_4_ = (uint)bVar3 * auVar68._8_4_ | (uint)!bVar3 * (int)uStack_1178;
      local_1ac0._12_4_ = (uint)bVar4 * auVar68._12_4_ | (uint)!bVar4 * uStack_1178._4_4_;
      uStack_1ab0._0_4_ = (uint)bVar5 * auVar68._16_4_ | (uint)!bVar5 * (int)uStack_1170;
      uStack_1ab0._4_4_ = (uint)bVar6 * auVar68._20_4_ | (uint)!bVar6 * uStack_1170._4_4_;
      auVar64 = _local_1ac0;
      uStack_1aa8._0_4_ = (uint)bVar7 * auVar68._24_4_ | (uint)!bVar7 * (int)uStack_1168;
      uStack_1aa8._4_4_ = (uint)bVar8 * auVar68._28_4_ | (uint)!bVar8 * uStack_1168._4_4_;
      auVar19 = _local_1ac0;
      uStack_1aa0._0_4_ =
           (uint)(bVar9 & 1) * auVar68._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_1160;
      uStack_1aa0._4_4_ = (uint)bVar10 * auVar68._36_4_ | (uint)!bVar10 * uStack_1160._4_4_;
      auVar65 = _local_1ac0;
      uStack_1a98._0_4_ = (uint)bVar11 * auVar68._40_4_ | (uint)!bVar11 * (int)uStack_1158;
      uStack_1a98._4_4_ = (uint)bVar12 * auVar68._44_4_ | (uint)!bVar12 * uStack_1158._4_4_;
      auVar63 = _local_1ac0;
      uStack_1a90._0_4_ = (uint)bVar13 * auVar68._48_4_ | (uint)!bVar13 * (int)uStack_1150;
      uStack_1a90._4_4_ = (uint)bVar14 * auVar68._52_4_ | (uint)!bVar14 * uStack_1150._4_4_;
      auVar66 = _local_1ac0;
      uStack_1a88._0_4_ = (uint)bVar15 * auVar68._56_4_ | (uint)!bVar15 * (int)uStack_1148;
      uStack_1a88._4_4_ =
           (uint)(bVar9 >> 7) * auVar68._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1148._4_4_;
      auVar68 = _local_1ac0;
      local_f80 = local_1ac0._0_8_;
      uStack_f78 = local_1ac0._8_8_;
      uStack_1ab0 = auVar64._16_8_;
      uStack_f70 = uStack_1ab0;
      uStack_1aa8 = auVar19._24_8_;
      uStack_f68 = uStack_1aa8;
      uStack_1aa0 = auVar65._32_8_;
      uStack_f60 = uStack_1aa0;
      uStack_1a98 = auVar63._40_8_;
      uStack_f58 = uStack_1a98;
      uStack_1a90 = auVar66._48_8_;
      uStack_f50 = uStack_1a90;
      uStack_1a88 = auVar68._56_8_;
      uStack_f48 = uStack_1a88;
      local_fc0[0] = 0.6933594;
      local_fc0[1] = 0.6933594;
      afStack_fb8[0] = 0.6933594;
      afStack_fb8[1] = 0.6933594;
      afStack_fb0[0] = 0.6933594;
      afStack_fb0[1] = 0.6933594;
      afStack_fa8[0] = 0.6933594;
      afStack_fa8[1] = 0.6933594;
      afStack_fa0[0] = 0.6933594;
      afStack_fa0[1] = 0.6933594;
      afStack_f98[0] = 0.6933594;
      afStack_f98[1] = 0.6933594;
      afStack_f90[0] = 0.6933594;
      afStack_f90[1] = 0.6933594;
      afStack_f88[0] = 0.6933594;
      afStack_f88[1] = 0.6933594;
      local_1000 = local_1a40._0_8_;
      uStack_ff8 = local_1a40._8_8_;
      uStack_ff0 = local_1a40._16_8_;
      uStack_fe8 = local_1a40._24_8_;
      uStack_fe0 = local_1a40._32_8_;
      uStack_fd8 = local_1a40._40_8_;
      uStack_fd0 = local_1a40._48_8_;
      uStack_fc8 = local_1a40._56_8_;
      auVar37._16_8_ = uStack_1ab0;
      auVar37._0_16_ = local_1ac0;
      auVar37._24_8_ = uStack_1aa8;
      auVar37._32_8_ = uStack_1aa0;
      auVar37._40_8_ = uStack_1a98;
      auVar37._48_8_ = uStack_1a90;
      auVar37._56_8_ = uStack_1a88;
      auVar36._8_4_ = 0.6933594;
      auVar36._12_4_ = 0.6933594;
      auVar36._0_4_ = 0.6933594;
      auVar36._4_4_ = 0.6933594;
      auVar36._16_4_ = 0.6933594;
      auVar36._20_4_ = 0.6933594;
      auVar36._24_4_ = 0.6933594;
      auVar36._28_4_ = 0.6933594;
      auVar36._32_4_ = 0.6933594;
      auVar36._36_4_ = 0.6933594;
      auVar36._40_4_ = 0.6933594;
      auVar36._44_4_ = 0.6933594;
      auVar36._48_4_ = 0.6933594;
      auVar36._52_4_ = 0.6933594;
      auVar36._56_4_ = 0.6933594;
      auVar36._60_4_ = 0.6933594;
      auVar67 = vfnmadd213ps_avx512f(auVar36,auVar37,auVar67);
      local_1040 = local_1ac0._0_8_;
      uStack_1038 = local_1ac0._8_8_;
      uStack_1030 = uStack_1ab0;
      uStack_1028 = uStack_1aa8;
      uStack_1020 = uStack_1aa0;
      uStack_1018 = uStack_1a98;
      uStack_1010 = uStack_1a90;
      uStack_1008 = uStack_1a88;
      local_1080[0] = -0.00021219444;
      local_1080[1] = -0.00021219444;
      afStack_1078[0] = -0.00021219444;
      afStack_1078[1] = -0.00021219444;
      afStack_1070[0] = -0.00021219444;
      afStack_1070[1] = -0.00021219444;
      afStack_1068[0] = -0.00021219444;
      afStack_1068[1] = -0.00021219444;
      afStack_1060[0] = -0.00021219444;
      afStack_1060[1] = -0.00021219444;
      afStack_1058[0] = -0.00021219444;
      afStack_1058[1] = -0.00021219444;
      afStack_1050[0] = -0.00021219444;
      afStack_1050[1] = -0.00021219444;
      afStack_1048[0] = -0.00021219444;
      afStack_1048[1] = -0.00021219444;
      local_1a40._0_8_ = auVar67._0_8_;
      local_10c0 = local_1a40._0_8_;
      local_1a40._8_8_ = auVar67._8_8_;
      uStack_10b8 = local_1a40._8_8_;
      local_1a40._16_8_ = auVar67._16_8_;
      uStack_10b0 = local_1a40._16_8_;
      local_1a40._24_8_ = auVar67._24_8_;
      uStack_10a8 = local_1a40._24_8_;
      local_1a40._32_8_ = auVar67._32_8_;
      uStack_10a0 = local_1a40._32_8_;
      local_1a40._40_8_ = auVar67._40_8_;
      uStack_1098 = local_1a40._40_8_;
      local_1a40._48_8_ = auVar67._48_8_;
      uStack_1090 = local_1a40._48_8_;
      local_1a40._56_8_ = auVar67._56_8_;
      uStack_1088 = local_1a40._56_8_;
      auVar35._16_8_ = uStack_1ab0;
      auVar35._0_16_ = local_1ac0;
      auVar35._24_8_ = uStack_1aa8;
      auVar35._32_8_ = uStack_1aa0;
      auVar35._40_8_ = uStack_1a98;
      auVar35._48_8_ = uStack_1a90;
      auVar35._56_8_ = uStack_1a88;
      auVar34._8_4_ = -0.00021219444;
      auVar34._12_4_ = -0.00021219444;
      auVar34._0_4_ = -0.00021219444;
      auVar34._4_4_ = -0.00021219444;
      auVar34._16_4_ = -0.00021219444;
      auVar34._20_4_ = -0.00021219444;
      auVar34._24_4_ = -0.00021219444;
      auVar34._28_4_ = -0.00021219444;
      auVar34._32_4_ = -0.00021219444;
      auVar34._36_4_ = -0.00021219444;
      auVar34._40_4_ = -0.00021219444;
      auVar34._44_4_ = -0.00021219444;
      auVar34._48_4_ = -0.00021219444;
      auVar34._52_4_ = -0.00021219444;
      auVar34._56_4_ = -0.00021219444;
      auVar34._60_4_ = -0.00021219444;
      local_1a40 = vfnmadd213ps_avx512f(auVar34,auVar35,auVar67);
      local_1900 = local_1a40._0_8_;
      uStack_18f8 = local_1a40._8_8_;
      uStack_18f0 = local_1a40._16_8_;
      uStack_18e8 = local_1a40._24_8_;
      uStack_18e0 = local_1a40._32_8_;
      uStack_18d8 = local_1a40._40_8_;
      uStack_18d0 = local_1a40._48_8_;
      uStack_18c8 = local_1a40._56_8_;
      local_1a80 = vmulps_avx512f(local_1a40,local_1a40);
      uStack_1bb8._0_4_ = 0.00019875691;
      uStack_1bb8._4_4_ = 0.00019875691;
      local_1bc0._0_4_ = 0.00019875691;
      local_1bc0._4_4_ = 0.00019875691;
      local_1340[0] = 0.00019875691;
      local_1340[1] = 0.00019875691;
      afStack_1338[0] = 0.00019875691;
      afStack_1338[1] = 0.00019875691;
      afStack_1330[0] = 0.00019875691;
      afStack_1330[1] = 0.00019875691;
      afStack_1328[0] = 0.00019875691;
      afStack_1328[1] = 0.00019875691;
      afStack_1320[0] = 0.00019875691;
      afStack_1320[1] = 0.00019875691;
      afStack_1318[0] = 0.00019875691;
      afStack_1318[1] = 0.00019875691;
      afStack_1310[0] = 0.00019875691;
      afStack_1310[1] = 0.00019875691;
      afStack_1308[0] = 0.00019875691;
      afStack_1308[1] = 0.00019875691;
      local_1380 = local_1a40._0_8_;
      uStack_1378 = local_1a40._8_8_;
      uStack_1370 = local_1a40._16_8_;
      uStack_1368 = local_1a40._24_8_;
      uStack_1360 = local_1a40._32_8_;
      uStack_1358 = local_1a40._40_8_;
      uStack_1350 = local_1a40._48_8_;
      uStack_1348 = local_1a40._56_8_;
      local_13c0[0] = 0.0013981999;
      local_13c0[1] = 0.0013981999;
      afStack_13b8[0] = 0.0013981999;
      afStack_13b8[1] = 0.0013981999;
      afStack_13b0[0] = 0.0013981999;
      afStack_13b0[1] = 0.0013981999;
      afStack_13a8[0] = 0.0013981999;
      afStack_13a8[1] = 0.0013981999;
      afStack_13a0[0] = 0.0013981999;
      afStack_13a0[1] = 0.0013981999;
      afStack_1398[0] = 0.0013981999;
      afStack_1398[1] = 0.0013981999;
      afStack_1390[0] = 0.0013981999;
      afStack_1390[1] = 0.0013981999;
      afStack_1388[0] = 0.0013981999;
      afStack_1388[1] = 0.0013981999;
      auVar30._16_4_ = 0.00019875691;
      auVar30._20_4_ = 0.00019875691;
      auVar30._0_16_ = _local_1bc0;
      auVar30._24_4_ = 0.00019875691;
      auVar30._28_4_ = 0.00019875691;
      auVar30._32_4_ = 0.00019875691;
      auVar30._36_4_ = 0.00019875691;
      auVar30._40_4_ = 0.00019875691;
      auVar30._44_4_ = 0.00019875691;
      auVar30._48_4_ = 0.00019875691;
      auVar30._52_4_ = 0.00019875691;
      auVar30._56_4_ = 0.00019875691;
      auVar30._60_4_ = 0.00019875691;
      auVar29._8_4_ = 0.0013981999;
      auVar29._12_4_ = 0.0013981999;
      auVar29._0_4_ = 0.0013981999;
      auVar29._4_4_ = 0.0013981999;
      auVar29._16_4_ = 0.0013981999;
      auVar29._20_4_ = 0.0013981999;
      auVar29._24_4_ = 0.0013981999;
      auVar29._28_4_ = 0.0013981999;
      auVar29._32_4_ = 0.0013981999;
      auVar29._36_4_ = 0.0013981999;
      auVar29._40_4_ = 0.0013981999;
      auVar29._44_4_ = 0.0013981999;
      auVar29._48_4_ = 0.0013981999;
      auVar29._52_4_ = 0.0013981999;
      auVar29._56_4_ = 0.0013981999;
      auVar29._60_4_ = 0.0013981999;
      auVar67 = vfmadd213ps_avx512f(local_1a40,auVar30,auVar29);
      local_1bc0 = auVar67._0_8_;
      local_1400 = local_1bc0;
      uStack_1bb8 = auVar67._8_8_;
      uStack_13f8 = uStack_1bb8;
      uStack_1bb0 = auVar67._16_8_;
      uStack_13f0 = uStack_1bb0;
      uStack_1ba8 = auVar67._24_8_;
      uStack_13e8 = uStack_1ba8;
      uStack_1ba0 = auVar67._32_8_;
      uStack_13e0 = uStack_1ba0;
      uStack_1b98 = auVar67._40_8_;
      uStack_13d8 = uStack_1b98;
      uStack_1b90 = auVar67._48_8_;
      uStack_13d0 = uStack_1b90;
      uStack_1b88 = auVar67._56_8_;
      uStack_13c8 = uStack_1b88;
      local_1440 = local_1a40._0_8_;
      uStack_1438 = local_1a40._8_8_;
      uStack_1430 = local_1a40._16_8_;
      uStack_1428 = local_1a40._24_8_;
      uStack_1420 = local_1a40._32_8_;
      uStack_1418 = local_1a40._40_8_;
      uStack_1410 = local_1a40._48_8_;
      uStack_1408 = local_1a40._56_8_;
      local_1480[0] = 0.008333452;
      local_1480[1] = 0.008333452;
      afStack_1478[0] = 0.008333452;
      afStack_1478[1] = 0.008333452;
      afStack_1470[0] = 0.008333452;
      afStack_1470[1] = 0.008333452;
      afStack_1468[0] = 0.008333452;
      afStack_1468[1] = 0.008333452;
      afStack_1460[0] = 0.008333452;
      afStack_1460[1] = 0.008333452;
      afStack_1458[0] = 0.008333452;
      afStack_1458[1] = 0.008333452;
      afStack_1450[0] = 0.008333452;
      afStack_1450[1] = 0.008333452;
      afStack_1448[0] = 0.008333452;
      afStack_1448[1] = 0.008333452;
      auVar28._8_4_ = 0.008333452;
      auVar28._12_4_ = 0.008333452;
      auVar28._0_4_ = 0.008333452;
      auVar28._4_4_ = 0.008333452;
      auVar28._16_4_ = 0.008333452;
      auVar28._20_4_ = 0.008333452;
      auVar28._24_4_ = 0.008333452;
      auVar28._28_4_ = 0.008333452;
      auVar28._32_4_ = 0.008333452;
      auVar28._36_4_ = 0.008333452;
      auVar28._40_4_ = 0.008333452;
      auVar28._44_4_ = 0.008333452;
      auVar28._48_4_ = 0.008333452;
      auVar28._52_4_ = 0.008333452;
      auVar28._56_4_ = 0.008333452;
      auVar28._60_4_ = 0.008333452;
      auVar67 = vfmadd213ps_avx512f(local_1a40,auVar67,auVar28);
      local_1bc0 = auVar67._0_8_;
      local_14c0 = local_1bc0;
      uStack_1bb8 = auVar67._8_8_;
      uStack_14b8 = uStack_1bb8;
      uStack_1bb0 = auVar67._16_8_;
      uStack_14b0 = uStack_1bb0;
      uStack_1ba8 = auVar67._24_8_;
      uStack_14a8 = uStack_1ba8;
      uStack_1ba0 = auVar67._32_8_;
      uStack_14a0 = uStack_1ba0;
      uStack_1b98 = auVar67._40_8_;
      uStack_1498 = uStack_1b98;
      uStack_1b90 = auVar67._48_8_;
      uStack_1490 = uStack_1b90;
      uStack_1b88 = auVar67._56_8_;
      uStack_1488 = uStack_1b88;
      local_1500 = local_1a40._0_8_;
      uStack_14f8 = local_1a40._8_8_;
      uStack_14f0 = local_1a40._16_8_;
      uStack_14e8 = local_1a40._24_8_;
      uStack_14e0 = local_1a40._32_8_;
      uStack_14d8 = local_1a40._40_8_;
      uStack_14d0 = local_1a40._48_8_;
      uStack_14c8 = local_1a40._56_8_;
      local_1540[0] = 0.041665796;
      local_1540[1] = 0.041665796;
      afStack_1538[0] = 0.041665796;
      afStack_1538[1] = 0.041665796;
      afStack_1530[0] = 0.041665796;
      afStack_1530[1] = 0.041665796;
      afStack_1528[0] = 0.041665796;
      afStack_1528[1] = 0.041665796;
      afStack_1520[0] = 0.041665796;
      afStack_1520[1] = 0.041665796;
      afStack_1518[0] = 0.041665796;
      afStack_1518[1] = 0.041665796;
      afStack_1510[0] = 0.041665796;
      afStack_1510[1] = 0.041665796;
      afStack_1508[0] = 0.041665796;
      afStack_1508[1] = 0.041665796;
      auVar27._8_4_ = 0.041665796;
      auVar27._12_4_ = 0.041665796;
      auVar27._0_4_ = 0.041665796;
      auVar27._4_4_ = 0.041665796;
      auVar27._16_4_ = 0.041665796;
      auVar27._20_4_ = 0.041665796;
      auVar27._24_4_ = 0.041665796;
      auVar27._28_4_ = 0.041665796;
      auVar27._32_4_ = 0.041665796;
      auVar27._36_4_ = 0.041665796;
      auVar27._40_4_ = 0.041665796;
      auVar27._44_4_ = 0.041665796;
      auVar27._48_4_ = 0.041665796;
      auVar27._52_4_ = 0.041665796;
      auVar27._56_4_ = 0.041665796;
      auVar27._60_4_ = 0.041665796;
      auVar67 = vfmadd213ps_avx512f(local_1a40,auVar67,auVar27);
      local_1bc0 = auVar67._0_8_;
      local_1580 = local_1bc0;
      uStack_1bb8 = auVar67._8_8_;
      uStack_1578 = uStack_1bb8;
      uStack_1bb0 = auVar67._16_8_;
      uStack_1570 = uStack_1bb0;
      uStack_1ba8 = auVar67._24_8_;
      uStack_1568 = uStack_1ba8;
      uStack_1ba0 = auVar67._32_8_;
      uStack_1560 = uStack_1ba0;
      uStack_1b98 = auVar67._40_8_;
      uStack_1558 = uStack_1b98;
      uStack_1b90 = auVar67._48_8_;
      uStack_1550 = uStack_1b90;
      uStack_1b88 = auVar67._56_8_;
      uStack_1548 = uStack_1b88;
      local_15c0 = local_1a40._0_8_;
      uStack_15b8 = local_1a40._8_8_;
      uStack_15b0 = local_1a40._16_8_;
      uStack_15a8 = local_1a40._24_8_;
      uStack_15a0 = local_1a40._32_8_;
      uStack_1598 = local_1a40._40_8_;
      uStack_1590 = local_1a40._48_8_;
      uStack_1588 = local_1a40._56_8_;
      local_1600[0] = 0.16666666;
      local_1600[1] = 0.16666666;
      afStack_15f8[0] = 0.16666666;
      afStack_15f8[1] = 0.16666666;
      afStack_15f0[0] = 0.16666666;
      afStack_15f0[1] = 0.16666666;
      afStack_15e8[0] = 0.16666666;
      afStack_15e8[1] = 0.16666666;
      afStack_15e0[0] = 0.16666666;
      afStack_15e0[1] = 0.16666666;
      afStack_15d8[0] = 0.16666666;
      afStack_15d8[1] = 0.16666666;
      afStack_15d0[0] = 0.16666666;
      afStack_15d0[1] = 0.16666666;
      afStack_15c8[0] = 0.16666666;
      afStack_15c8[1] = 0.16666666;
      auVar26._8_4_ = 0.16666666;
      auVar26._12_4_ = 0.16666666;
      auVar26._0_4_ = 0.16666666;
      auVar26._4_4_ = 0.16666666;
      auVar26._16_4_ = 0.16666666;
      auVar26._20_4_ = 0.16666666;
      auVar26._24_4_ = 0.16666666;
      auVar26._28_4_ = 0.16666666;
      auVar26._32_4_ = 0.16666666;
      auVar26._36_4_ = 0.16666666;
      auVar26._40_4_ = 0.16666666;
      auVar26._44_4_ = 0.16666666;
      auVar26._48_4_ = 0.16666666;
      auVar26._52_4_ = 0.16666666;
      auVar26._56_4_ = 0.16666666;
      auVar26._60_4_ = 0.16666666;
      auVar67 = vfmadd213ps_avx512f(local_1a40,auVar67,auVar26);
      local_1bc0 = auVar67._0_8_;
      local_1640 = local_1bc0;
      uStack_1bb8 = auVar67._8_8_;
      uStack_1638 = uStack_1bb8;
      uStack_1bb0 = auVar67._16_8_;
      uStack_1630 = uStack_1bb0;
      uStack_1ba8 = auVar67._24_8_;
      uStack_1628 = uStack_1ba8;
      uStack_1ba0 = auVar67._32_8_;
      uStack_1620 = uStack_1ba0;
      uStack_1b98 = auVar67._40_8_;
      uStack_1618 = uStack_1b98;
      uStack_1b90 = auVar67._48_8_;
      uStack_1610 = uStack_1b90;
      uStack_1b88 = auVar67._56_8_;
      uStack_1608 = uStack_1b88;
      local_1680 = local_1a40._0_8_;
      uStack_1678 = local_1a40._8_8_;
      uStack_1670 = local_1a40._16_8_;
      uStack_1668 = local_1a40._24_8_;
      uStack_1660 = local_1a40._32_8_;
      uStack_1658 = local_1a40._40_8_;
      uStack_1650 = local_1a40._48_8_;
      uStack_1648 = local_1a40._56_8_;
      local_16c0[0] = 0.5;
      local_16c0[1] = 0.5;
      afStack_16b8[0] = 0.5;
      afStack_16b8[1] = 0.5;
      afStack_16b0[0] = 0.5;
      afStack_16b0[1] = 0.5;
      afStack_16a8[0] = 0.5;
      afStack_16a8[1] = 0.5;
      afStack_16a0[0] = 0.5;
      afStack_16a0[1] = 0.5;
      afStack_1698[0] = 0.5;
      afStack_1698[1] = 0.5;
      afStack_1690[0] = 0.5;
      afStack_1690[1] = 0.5;
      afStack_1688[0] = 0.5;
      afStack_1688[1] = 0.5;
      auVar69._8_4_ = 0.5;
      auVar69._12_4_ = 0.5;
      auVar69._0_4_ = 0.5;
      auVar69._4_4_ = 0.5;
      auVar69._16_4_ = 0.5;
      auVar69._20_4_ = 0.5;
      auVar69._24_4_ = 0.5;
      auVar69._28_4_ = 0.5;
      auVar69._32_4_ = 0.5;
      auVar69._36_4_ = 0.5;
      auVar69._40_4_ = 0.5;
      auVar69._44_4_ = 0.5;
      auVar69._48_4_ = 0.5;
      auVar69._52_4_ = 0.5;
      auVar69._56_4_ = 0.5;
      auVar69._60_4_ = 0.5;
      auVar67 = vfmadd213ps_avx512f(local_1a40,auVar67,auVar69);
      local_1bc0 = auVar67._0_8_;
      local_1700 = local_1bc0;
      uStack_1bb8 = auVar67._8_8_;
      uStack_16f8 = uStack_1bb8;
      uStack_1bb0 = auVar67._16_8_;
      uStack_16f0 = uStack_1bb0;
      uStack_1ba8 = auVar67._24_8_;
      uStack_16e8 = uStack_1ba8;
      uStack_1ba0 = auVar67._32_8_;
      uStack_16e0 = uStack_1ba0;
      uStack_1b98 = auVar67._40_8_;
      uStack_16d8 = uStack_1b98;
      uStack_1b90 = auVar67._48_8_;
      uStack_16d0 = uStack_1b90;
      uStack_1b88 = auVar67._56_8_;
      uStack_16c8 = uStack_1b88;
      local_1740 = local_1a80._0_8_;
      uStack_1738 = local_1a80._8_8_;
      uStack_1730 = local_1a80._16_8_;
      uStack_1728 = local_1a80._24_8_;
      uStack_1720 = local_1a80._32_8_;
      uStack_1718 = local_1a80._40_8_;
      uStack_1710 = local_1a80._48_8_;
      uStack_1708 = local_1a80._56_8_;
      local_1780 = local_1a40._0_8_;
      uStack_1778 = local_1a40._8_8_;
      uStack_1770 = local_1a40._16_8_;
      uStack_1768 = local_1a40._24_8_;
      uStack_1760 = local_1a40._32_8_;
      uStack_1758 = local_1a40._40_8_;
      uStack_1750 = local_1a40._48_8_;
      uStack_1748 = local_1a40._56_8_;
      auVar67 = vfmadd213ps_avx512f(local_1a80,auVar67,local_1a40);
      local_1bc0 = auVar67._0_8_;
      local_f00 = local_1bc0;
      uStack_1bb8 = auVar67._8_8_;
      uStack_ef8 = uStack_1bb8;
      uStack_1bb0 = auVar67._16_8_;
      uStack_ef0 = uStack_1bb0;
      uStack_1ba8 = auVar67._24_8_;
      uStack_ee8 = uStack_1ba8;
      uStack_1ba0 = auVar67._32_8_;
      uStack_ee0 = uStack_1ba0;
      uStack_1b98 = auVar67._40_8_;
      uStack_ed8 = uStack_1b98;
      uStack_1b90 = auVar67._48_8_;
      uStack_ed0 = uStack_1b90;
      uStack_1b88 = auVar67._56_8_;
      uStack_ec8 = uStack_1b88;
      local_f40[0] = 1.0;
      local_f40[1] = 1.0;
      afStack_f38[0] = 1.0;
      afStack_f38[1] = 1.0;
      afStack_f30[0] = 1.0;
      afStack_f30[1] = 1.0;
      afStack_f28[0] = 1.0;
      afStack_f28[1] = 1.0;
      afStack_f20[0] = 1.0;
      afStack_f20[1] = 1.0;
      afStack_f18[0] = 1.0;
      afStack_f18[1] = 1.0;
      afStack_f10[0] = 1.0;
      afStack_f10[1] = 1.0;
      afStack_f08[0] = 1.0;
      afStack_f08[1] = 1.0;
      auVar38._8_4_ = 1.0;
      auVar38._12_4_ = 1.0;
      auVar38._0_4_ = 1.0;
      auVar38._4_4_ = 1.0;
      auVar38._16_4_ = 1.0;
      auVar38._20_4_ = 1.0;
      auVar38._24_4_ = 1.0;
      auVar38._28_4_ = 1.0;
      auVar38._32_4_ = 1.0;
      auVar38._36_4_ = 1.0;
      auVar38._40_4_ = 1.0;
      auVar38._44_4_ = 1.0;
      auVar38._48_4_ = 1.0;
      auVar38._52_4_ = 1.0;
      auVar38._56_4_ = 1.0;
      auVar38._60_4_ = 1.0;
      local_1940 = vaddps_avx512f(auVar67,auVar38);
      local_ec0 = local_1ac0._0_8_;
      uStack_eb8 = local_1ac0._8_8_;
      uStack_eb0 = uStack_1ab0;
      uStack_ea8 = uStack_1aa8;
      uStack_ea0 = uStack_1aa0;
      uStack_e98 = uStack_1a98;
      uStack_e90 = uStack_1a90;
      uStack_e88 = uStack_1a88;
      auVar39._16_8_ = uStack_1ab0;
      auVar39._0_16_ = local_1ac0;
      auVar39._24_8_ = uStack_1aa8;
      auVar39._32_8_ = uStack_1aa0;
      auVar39._40_8_ = uStack_1a98;
      auVar39._48_8_ = uStack_1a90;
      auVar39._56_8_ = uStack_1a88;
      local_d80 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(local_d80);
      auVar67 = vcvttps2dq_avx512f(auVar39);
      auVar67 = vmovdqa64_avx512f(auVar67);
      auVar67 = vmovdqa64_avx512f(auVar67);
      auVar69 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      local_e40 = vmovdqa64_avx512f(auVar67);
      local_e80 = vmovdqa64_avx512f(auVar69);
      auVar67 = vmovdqa64_avx512f(local_e40);
      auVar69 = vmovdqa64_avx512f(local_e80);
      auVar67 = vpaddd_avx512f(auVar67,auVar69);
      auVar67 = vmovdqa64_avx512f(auVar67);
      auVar67 = vmovdqa64_avx512f(auVar67);
      local_dc0 = vmovdqa64_avx512f(auVar67);
      local_dc4 = 0x17;
      auVar67 = vmovdqa64_avx512f(local_dc0);
      auVar67 = vpslld_avx512f(auVar67,ZEXT416(0x17));
      local_1b00 = vmovdqa64_avx512f(auVar67);
      auVar67 = vmovdqa64_avx512f(local_1b00);
      local_1a00 = vmovdqa64_avx512f(auVar67);
      local_1c00 = vmovdqa64_avx512f(local_1a00);
      local_1980 = local_1c00._0_8_;
      uStack_1978 = local_1c00._8_8_;
      uStack_1970 = local_1c00._16_8_;
      uStack_1968 = local_1c00._24_8_;
      uStack_1960 = local_1c00._32_8_;
      uStack_1958 = local_1c00._40_8_;
      uStack_1950 = local_1c00._48_8_;
      uStack_1948 = local_1c00._56_8_;
      _local_1bc0 = vmulps_avx512f(local_1940,local_1c00);
      local_1e80 = local_1bc0;
      uStack_1e78 = uStack_1bb8;
      uStack_1e70 = uStack_1bb0;
      uStack_1e68 = uStack_1ba8;
      uStack_1e60 = uStack_1ba0;
      uStack_1e58 = uStack_1b98;
      uStack_1e50 = uStack_1b90;
      uStack_1e48 = uStack_1b88;
      local_1d10 = local_1df0;
      local_1d80 = local_1bc0;
      uStack_1d78 = uStack_1bb8;
      uStack_1d70 = uStack_1bb0;
      uStack_1d68 = uStack_1ba8;
      uStack_1d60 = uStack_1ba0;
      uStack_1d58 = uStack_1b98;
      uStack_1d50 = uStack_1b90;
      uStack_1d48 = uStack_1b88;
      *local_1df0 = _local_1bc0;
      local_1df0 = local_1df0 + 1;
      _local_1ac0 = auVar68;
      local_18c0 = local_1900;
      uStack_18b8 = uStack_18f8;
      uStack_18b0 = uStack_18f0;
      uStack_18a8 = uStack_18e8;
      uStack_18a0 = uStack_18e0;
      uStack_1898 = uStack_18d8;
      uStack_1890 = uStack_18d0;
      uStack_1888 = uStack_18c8;
      local_1182 = local_1b42;
      local_1180 = local_1200;
      uStack_1178 = uStack_11f8;
      uStack_1170 = uStack_11f0;
      uStack_1168 = uStack_11e8;
      uStack_1160 = uStack_11e0;
      uStack_1158 = uStack_11d8;
      uStack_1150 = uStack_11d0;
      uStack_1148 = uStack_11c8;
    }
    for (; local_1e3c + 7 < local_1de4; local_1e3c = local_1e3c + 8) {
      local_1d08 = local_1df0;
      uStack_ad0 = *(undefined8 *)(*local_1df0 + 0x10);
      uStack_ac8 = *(undefined8 *)(*local_1df0 + 0x18);
      local_1c28 = local_1dc9;
      local_1c30 = &local_1ea0;
      local_ba0 = 0;
      uStack_b98 = 0;
      uStack_b90 = 0;
      uStack_b88 = 0;
      local_ce0 = 0x3f800000;
      uStack_cdc = 0x3f800000;
      uStack_cd8 = 0x3f800000;
      uStack_cd4 = 0x3f800000;
      uStack_cd0 = 0x3f800000;
      uStack_ccc = 0x3f800000;
      uStack_cc8 = 0x3f800000;
      uStack_cc4 = 0x3f800000;
      local_c60._0_8_ = SUB168(*(undefined1 (*) [16])*local_1df0,0);
      local_ae0 = local_c60._0_8_;
      local_c60._8_8_ = SUB168(*(undefined1 (*) [16])*local_1df0,8);
      uStack_ad8 = local_c60._8_8_;
      local_b00 = 0x42b0c0a5;
      uStack_afc = 0x42b0c0a5;
      uStack_af8 = 0x42b0c0a5;
      uStack_af4 = 0x42b0c0a5;
      uStack_af0 = 0x42b0c0a5;
      uStack_aec = 0x42b0c0a5;
      uStack_ae8 = 0x42b0c0a5;
      uStack_ae4 = 0x42b0c0a5;
      auVar18._8_4_ = 0x42b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar18._12_4_ = 0x42b0c0a5;
      auVar18._16_4_ = 0x42b0c0a5;
      auVar18._20_4_ = 0x42b0c0a5;
      auVar18._24_4_ = 0x42b0c0a5;
      auVar18._28_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx(*(undefined1 (*) [32])*local_1df0,auVar18);
      local_c60._0_8_ = auVar19._0_8_;
      local_aa0 = local_c60._0_8_;
      local_c60._8_8_ = auVar19._8_8_;
      uStack_a98 = local_c60._8_8_;
      local_c60._16_8_ = auVar19._16_8_;
      uStack_a90 = local_c60._16_8_;
      local_c60._24_8_ = auVar19._24_8_;
      uStack_a88 = local_c60._24_8_;
      local_ac0 = 0xc2b0c0a5;
      uStack_abc = 0xc2b0c0a5;
      uStack_ab8 = 0xc2b0c0a5;
      uStack_ab4 = 0xc2b0c0a5;
      uStack_ab0 = 0xc2b0c0a5;
      uStack_aac = 0xc2b0c0a5;
      uStack_aa8 = 0xc2b0c0a5;
      uStack_aa4 = 0xc2b0c0a5;
      auVar20._8_4_ = 0xc2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._12_4_ = 0xc2b0c0a5;
      auVar20._16_4_ = 0xc2b0c0a5;
      auVar20._20_4_ = 0xc2b0c0a5;
      auVar20._24_4_ = 0xc2b0c0a5;
      auVar20._28_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar19,auVar20);
      local_a78 = local_c60;
      local_9e0 = ::_ps256_cephes_LOG2EF;
      local_9e8 = ::_ps256_0p5;
      local_c60._0_8_ = auVar18._0_8_;
      local_880 = local_c60._0_8_;
      local_c60._8_8_ = auVar18._8_8_;
      uStack_878 = local_c60._8_8_;
      local_c60._16_8_ = auVar18._16_8_;
      uStack_870 = local_c60._16_8_;
      local_c60._24_8_ = auVar18._24_8_;
      uStack_868 = local_c60._24_8_;
      local_8a0[0] = 1.442695;
      local_8a0[1] = 1.442695;
      afStack_898[0] = 1.442695;
      afStack_898[1] = 1.442695;
      afStack_890[0] = 1.442695;
      afStack_890[1] = 1.442695;
      afStack_888[0] = 1.442695;
      afStack_888[1] = 1.442695;
      local_8c0[0] = 0.5;
      local_8c0[1] = 0.5;
      afStack_8b8[0] = 0.5;
      afStack_8b8[1] = 0.5;
      afStack_8b0[0] = 0.5;
      afStack_8b0[1] = 0.5;
      afStack_8a8[0] = 0.5;
      afStack_8a8[1] = 0.5;
      auVar41._8_4_ = 1.442695;
      auVar41._12_4_ = 1.442695;
      auVar41._0_4_ = 1.442695;
      auVar41._4_4_ = 1.442695;
      auVar41._16_4_ = 1.442695;
      auVar41._20_4_ = 1.442695;
      auVar41._24_4_ = 1.442695;
      auVar41._28_4_ = 1.442695;
      auVar40._8_4_ = 0.5;
      auVar40._12_4_ = 0.5;
      auVar40._0_4_ = 0.5;
      auVar40._4_4_ = 0.5;
      auVar40._16_4_ = 0.5;
      auVar40._20_4_ = 0.5;
      auVar40._24_4_ = 0.5;
      auVar40._28_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(auVar41,auVar18,auVar40);
      auVar20 = vroundps_avx(ZEXT1632(auVar22),1);
      auVar19 = vcmpps_avx(ZEXT1632(auVar22),auVar20,1);
      local_d00._0_8_ = auVar19._0_8_;
      local_c00 = local_d00._0_8_;
      local_d00._8_8_ = auVar19._8_8_;
      uStack_bf8 = local_d00._8_8_;
      local_d00._16_8_ = auVar19._16_8_;
      uStack_bf0 = local_d00._16_8_;
      local_d00._24_8_ = auVar19._24_8_;
      uStack_be8 = local_d00._24_8_;
      local_c20 = 0x3f8000003f800000;
      uStack_c18 = 0x3f8000003f800000;
      uStack_c10 = 0x3f8000003f800000;
      uStack_c08 = 0x3f8000003f800000;
      auVar70._8_8_ = 0x3f8000003f800000;
      auVar70._0_8_ = 0x3f8000003f800000;
      auVar70._16_8_ = 0x3f8000003f800000;
      auVar70._24_8_ = 0x3f8000003f800000;
      local_d00 = vpand_avx2(auVar19,auVar70);
      local_c80 = auVar20._0_8_;
      local_bc0 = local_c80;
      uStack_c78 = auVar20._8_8_;
      uStack_bb8 = uStack_c78;
      uStack_c70 = auVar20._16_8_;
      uStack_bb0 = uStack_c70;
      uStack_c68 = auVar20._24_8_;
      uStack_ba8 = uStack_c68;
      local_be0 = local_d00._0_8_;
      uStack_bd8 = local_d00._8_8_;
      uStack_bd0 = local_d00._16_8_;
      uStack_bc8 = local_d00._24_8_;
      local_ca0 = vsubps_avx(auVar20,local_d00);
      local_9c0 = local_ca0;
      local_9b0 = ::_ps256_cephes_exp_C1;
      local_5e0 = local_ca0._0_8_;
      uStack_5d8 = local_ca0._8_8_;
      uStack_5d0 = local_ca0._16_8_;
      uStack_5c8 = local_ca0._24_8_;
      local_600[0] = 0.6933594;
      local_600[1] = 0.6933594;
      afStack_5f8[0] = 0.6933594;
      afStack_5f8[1] = 0.6933594;
      afStack_5f0[0] = 0.6933594;
      afStack_5f0[1] = 0.6933594;
      afStack_5e8[0] = 0.6933594;
      afStack_5e8[1] = 0.6933594;
      local_620 = local_c60._0_8_;
      uStack_618 = local_c60._8_8_;
      uStack_610 = local_c60._16_8_;
      uStack_608 = local_c60._24_8_;
      auVar47._8_4_ = 0.6933594;
      auVar47._12_4_ = 0.6933594;
      auVar47._0_4_ = 0.6933594;
      auVar47._4_4_ = 0.6933594;
      auVar47._16_4_ = 0.6933594;
      auVar47._20_4_ = 0.6933594;
      auVar47._24_4_ = 0.6933594;
      auVar47._28_4_ = 0.6933594;
      auVar22 = vfnmadd213ps_fma(auVar47,local_ca0,auVar18);
      local_9c8 = ::_ps256_cephes_exp_C2;
      local_580 = local_ca0._0_8_;
      uStack_578 = local_ca0._8_8_;
      uStack_570 = local_ca0._16_8_;
      uStack_568 = local_ca0._24_8_;
      local_5a0[0] = -0.00021219444;
      local_5a0[1] = -0.00021219444;
      afStack_598[0] = -0.00021219444;
      afStack_598[1] = -0.00021219444;
      afStack_590[0] = -0.00021219444;
      afStack_590[1] = -0.00021219444;
      afStack_588[0] = -0.00021219444;
      afStack_588[1] = -0.00021219444;
      local_c60._0_8_ = auVar22._0_8_;
      local_5c0 = local_c60._0_8_;
      local_c60._8_8_ = auVar22._8_8_;
      uStack_5b8 = local_c60._8_8_;
      uStack_5b0 = 0;
      uStack_5a8 = 0;
      auVar48._8_4_ = -0.00021219444;
      auVar48._12_4_ = -0.00021219444;
      auVar48._0_4_ = -0.00021219444;
      auVar48._4_4_ = -0.00021219444;
      auVar48._16_4_ = -0.00021219444;
      auVar48._20_4_ = -0.00021219444;
      auVar48._24_4_ = -0.00021219444;
      auVar48._28_4_ = -0.00021219444;
      auVar22 = vfnmadd213ps_fma(auVar48,local_ca0,ZEXT1632(auVar22));
      auVar70 = ZEXT1632(auVar22);
      local_c60._0_8_ = auVar22._0_8_;
      local_b40 = local_c60._0_8_;
      local_c60._8_8_ = auVar22._8_8_;
      uStack_b38 = local_c60._8_8_;
      uStack_b30 = 0;
      uStack_b28 = 0;
      local_b20._0_4_ = auVar22._0_4_;
      local_b20._4_4_ = auVar22._4_4_;
      uStack_b18._0_4_ = auVar22._8_4_;
      uStack_b18._4_4_ = auVar22._12_4_;
      local_c80._4_4_ = local_b20._4_4_ * local_b20._4_4_;
      local_c80._0_4_ = (float)local_b20 * (float)local_b20;
      local_660 = local_c80;
      uStack_c78._0_4_ = (float)uStack_b18 * (float)uStack_b18;
      uStack_c78._4_4_ = uStack_b18._4_4_ * uStack_b18._4_4_;
      auVar16 = _local_c80;
      _local_c80 = ZEXT1632(_local_c80);
      auVar20 = _local_c80;
      uStack_d18._0_4_ = 0x39506967;
      local_d20 = (undefined1  [8])0x3950696739506967;
      uStack_d18._4_4_ = 0x39506967;
      uStack_d10._0_4_ = 0x39506967;
      uStack_d10._4_4_ = 0x39506967;
      auVar64 = _local_d20;
      uStack_d08._0_4_ = 0x39506967;
      uStack_d08._4_4_ = 0x39506967;
      auVar19 = _local_d20;
      local_a68 = local_d20;
      local_a00 = ::_ps256_cephes_exp_p1;
      local_820 = 0x3950696739506967;
      uStack_818 = uStack_d18;
      uStack_d10 = auVar64._16_8_;
      uStack_810 = uStack_d10;
      uStack_d08 = auVar19._24_8_;
      uStack_808 = uStack_d08;
      local_840 = local_c60._0_8_;
      uStack_838 = local_c60._8_8_;
      uStack_830 = 0;
      uStack_828 = 0;
      local_860[0] = 0.0013981999;
      local_860[1] = 0.0013981999;
      afStack_858[0] = 0.0013981999;
      afStack_858[1] = 0.0013981999;
      afStack_850[0] = 0.0013981999;
      afStack_850[1] = 0.0013981999;
      afStack_848[0] = 0.0013981999;
      afStack_848[1] = 0.0013981999;
      auVar42._8_4_ = 0.0013981999;
      auVar42._12_4_ = 0.0013981999;
      auVar42._0_4_ = 0.0013981999;
      auVar42._4_4_ = 0.0013981999;
      auVar42._16_4_ = 0.0013981999;
      auVar42._20_4_ = 0.0013981999;
      auVar42._24_4_ = 0.0013981999;
      auVar42._28_4_ = 0.0013981999;
      auVar22 = vfmadd213ps_fma(auVar70,auVar19,auVar42);
      local_a18 = ::_ps256_cephes_exp_p2;
      local_d20 = auVar22._0_8_;
      local_7c0 = local_d20;
      uStack_d18 = auVar22._8_8_;
      uStack_7b8 = uStack_d18;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      local_7e0 = local_c60._0_8_;
      uStack_7d8 = local_c60._8_8_;
      uStack_7d0 = 0;
      uStack_7c8 = 0;
      local_800[0] = 0.008333452;
      local_800[1] = 0.008333452;
      afStack_7f8[0] = 0.008333452;
      afStack_7f8[1] = 0.008333452;
      afStack_7f0[0] = 0.008333452;
      afStack_7f0[1] = 0.008333452;
      afStack_7e8[0] = 0.008333452;
      afStack_7e8[1] = 0.008333452;
      auVar43._8_4_ = 0.008333452;
      auVar43._12_4_ = 0.008333452;
      auVar43._0_4_ = 0.008333452;
      auVar43._4_4_ = 0.008333452;
      auVar43._16_4_ = 0.008333452;
      auVar43._20_4_ = 0.008333452;
      auVar43._24_4_ = 0.008333452;
      auVar43._28_4_ = 0.008333452;
      auVar22 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar22),auVar43);
      local_a30 = ::_ps256_cephes_exp_p3;
      local_d20 = auVar22._0_8_;
      local_760 = local_d20;
      uStack_d18 = auVar22._8_8_;
      uStack_758 = uStack_d18;
      uStack_750 = 0;
      uStack_748 = 0;
      local_780 = local_c60._0_8_;
      uStack_778 = local_c60._8_8_;
      uStack_770 = 0;
      uStack_768 = 0;
      local_7a0[0] = 0.041665796;
      local_7a0[1] = 0.041665796;
      afStack_798[0] = 0.041665796;
      afStack_798[1] = 0.041665796;
      afStack_790[0] = 0.041665796;
      afStack_790[1] = 0.041665796;
      afStack_788[0] = 0.041665796;
      afStack_788[1] = 0.041665796;
      auVar44._8_4_ = 0.041665796;
      auVar44._12_4_ = 0.041665796;
      auVar44._0_4_ = 0.041665796;
      auVar44._4_4_ = 0.041665796;
      auVar44._16_4_ = 0.041665796;
      auVar44._20_4_ = 0.041665796;
      auVar44._24_4_ = 0.041665796;
      auVar44._28_4_ = 0.041665796;
      auVar22 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar22),auVar44);
      local_a48 = ::_ps256_cephes_exp_p4;
      local_d20 = auVar22._0_8_;
      local_700 = local_d20;
      uStack_d18 = auVar22._8_8_;
      uStack_6f8 = uStack_d18;
      uStack_6f0 = 0;
      uStack_6e8 = 0;
      local_720 = local_c60._0_8_;
      uStack_718 = local_c60._8_8_;
      uStack_710 = 0;
      uStack_708 = 0;
      local_740[0] = 0.16666666;
      local_740[1] = 0.16666666;
      afStack_738[0] = 0.16666666;
      afStack_738[1] = 0.16666666;
      afStack_730[0] = 0.16666666;
      afStack_730[1] = 0.16666666;
      afStack_728[0] = 0.16666666;
      afStack_728[1] = 0.16666666;
      auVar45._8_4_ = 0.16666666;
      auVar45._12_4_ = 0.16666666;
      auVar45._0_4_ = 0.16666666;
      auVar45._4_4_ = 0.16666666;
      auVar45._16_4_ = 0.16666666;
      auVar45._20_4_ = 0.16666666;
      auVar45._24_4_ = 0.16666666;
      auVar45._28_4_ = 0.16666666;
      auVar22 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar22),auVar45);
      local_a60 = ::_ps256_cephes_exp_p5;
      local_d20 = auVar22._0_8_;
      local_6a0 = local_d20;
      uStack_d18 = auVar22._8_8_;
      uStack_698 = uStack_d18;
      uStack_690 = 0;
      uStack_688 = 0;
      local_6c0 = local_c60._0_8_;
      uStack_6b8 = local_c60._8_8_;
      uStack_6b0 = 0;
      uStack_6a8 = 0;
      local_6e0[0] = 0.5;
      local_6e0[1] = 0.5;
      afStack_6d8[0] = 0.5;
      afStack_6d8[1] = 0.5;
      afStack_6d0[0] = 0.5;
      afStack_6d0[1] = 0.5;
      afStack_6c8[0] = 0.5;
      afStack_6c8[1] = 0.5;
      auVar46._8_4_ = 0.5;
      auVar46._12_4_ = 0.5;
      auVar46._0_4_ = 0.5;
      auVar46._4_4_ = 0.5;
      auVar46._16_4_ = 0.5;
      auVar46._20_4_ = 0.5;
      auVar46._24_4_ = 0.5;
      auVar46._28_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(auVar70,ZEXT1632(auVar22),auVar46);
      local_a70 = local_c80;
      local_d20 = auVar22._0_8_;
      local_640 = local_d20;
      uStack_d18 = auVar22._8_8_;
      uStack_638 = uStack_d18;
      uStack_630 = 0;
      uStack_628 = 0;
      uStack_c78 = auVar16._8_8_;
      uStack_658 = uStack_c78;
      uStack_650 = 0;
      uStack_648 = 0;
      local_680 = local_c60._0_8_;
      uStack_678 = local_c60._8_8_;
      uStack_670 = 0;
      uStack_668 = 0;
      auVar22 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar22),auVar70);
      local_d20 = auVar22._0_8_;
      uVar21 = local_d20;
      uStack_d18 = auVar22._8_8_;
      uVar23 = uStack_d18;
      uStack_970 = 0;
      uStack_968 = 0;
      local_9a0 = 0x3f8000003f800000;
      uStack_998 = 0x3f8000003f800000;
      uStack_990 = 0x3f8000003f800000;
      uStack_988 = 0x3f8000003f800000;
      local_980._0_4_ = auVar22._0_4_;
      local_980._4_4_ = auVar22._4_4_;
      uStack_978._0_4_ = auVar22._8_4_;
      uStack_978._4_4_ = auVar22._12_4_;
      local_d20._4_4_ = local_980._4_4_ + 1.0;
      local_d20._0_4_ = (float)local_980 + 1.0;
      uStack_d18._0_4_ = (float)uStack_978 + 1.0;
      uStack_d18._4_4_ = uStack_978._4_4_ + 1.0;
      uStack_d10._0_4_ = 0x3f800000;
      uStack_d10._4_4_ = 0x3f800000;
      uStack_d08._0_4_ = 0x3f800000;
      uStack_d08._4_4_ = 0x3f800000;
      local_960._0_4_ = local_ca0._0_4_;
      local_960._4_4_ = local_ca0._4_4_;
      uStack_958._0_4_ = local_ca0._8_4_;
      uStack_958._4_4_ = local_ca0._12_4_;
      uStack_950._0_4_ = local_ca0._16_4_;
      uStack_950._4_4_ = local_ca0._20_4_;
      uStack_948._0_4_ = local_ca0._24_4_;
      uStack_948._4_4_ = local_ca0._28_4_;
      local_cc0._4_4_ = (int)local_960._4_4_;
      local_cc0._0_4_ = (int)(float)local_960;
      local_cc0._8_4_ = (int)(float)uStack_958;
      local_cc0._12_4_ = (int)uStack_958._4_4_;
      local_cc0._16_4_ = (int)(float)uStack_950;
      local_cc0._20_4_ = (int)uStack_950._4_4_;
      auVar64 = local_cc0._0_24_;
      local_cc0._24_4_ = (int)(float)uStack_948;
      local_cc0._28_4_ = (int)uStack_948._4_4_;
      auVar19 = local_cc0;
      local_920 = local_cc0._0_8_;
      uStack_918 = local_cc0._8_8_;
      local_cc0._16_8_ = auVar64._16_8_;
      uStack_910 = local_cc0._16_8_;
      local_cc0._24_8_ = auVar19._24_8_;
      uStack_908 = local_cc0._24_8_;
      local_940 = 0x7f0000007f;
      uStack_938 = 0x7f0000007f;
      uStack_930 = 0x7f0000007f;
      uStack_928 = 0x7f0000007f;
      local_540 = local_cc0._0_8_;
      uStack_538 = local_cc0._8_8_;
      uStack_530 = local_cc0._16_8_;
      uStack_528 = local_cc0._24_8_;
      local_560 = 0x7f0000007f;
      uStack_558 = 0x7f0000007f;
      uStack_550 = 0x7f0000007f;
      uStack_548 = 0x7f0000007f;
      auVar50._16_8_ = local_cc0._16_8_;
      auVar50._0_16_ = local_cc0._0_16_;
      auVar50._24_8_ = local_cc0._24_8_;
      auVar49._8_8_ = 0x7f0000007f;
      auVar49._0_8_ = 0x7f0000007f;
      auVar49._16_8_ = 0x7f0000007f;
      auVar49._24_8_ = 0x7f0000007f;
      auVar19 = vpaddd_avx2(auVar50,auVar49);
      local_cc0._0_8_ = auVar19._0_8_;
      local_8e0 = local_cc0._0_8_;
      local_cc0._8_8_ = auVar19._8_8_;
      uStack_8d8 = local_cc0._8_8_;
      local_cc0._16_8_ = auVar19._16_8_;
      uStack_8d0 = local_cc0._16_8_;
      local_cc0._24_8_ = auVar19._24_8_;
      uStack_8c8 = local_cc0._24_8_;
      local_8e4 = 0x17;
      local_500 = local_cc0._0_8_;
      uStack_4f8 = local_cc0._8_8_;
      uStack_4f0 = local_cc0._16_8_;
      uStack_4e8 = local_cc0._24_8_;
      local_504 = 0x17;
      local_cc0 = vpslld_avx2(auVar19,ZEXT416(0x17));
      local_c40 = local_cc0._0_8_;
      uStack_c38 = local_cc0._8_8_;
      uStack_c30 = local_cc0._16_8_;
      uStack_c28 = local_cc0._24_8_;
      local_d40 = local_cc0._0_8_;
      uStack_d38 = local_cc0._8_8_;
      uStack_d30 = local_cc0._16_8_;
      uStack_d28 = local_cc0._24_8_;
      local_b60 = _local_d20;
      local_b80._0_4_ = local_cc0._0_4_;
      local_b80._4_4_ = local_cc0._4_4_;
      uStack_b78._0_4_ = local_cc0._8_4_;
      uStack_b78._4_4_ = local_cc0._12_4_;
      uStack_b70._0_4_ = local_cc0._16_4_;
      uStack_b70._4_4_ = local_cc0._20_4_;
      uStack_b68._0_4_ = local_cc0._24_4_;
      local_d20._4_4_ = (local_980._4_4_ + 1.0) * local_b80._4_4_;
      local_d20._0_4_ = ((float)local_980 + 1.0) * (float)local_b80;
      uStack_d18._0_4_ = ((float)uStack_978 + 1.0) * (float)uStack_b78;
      uStack_d18._4_4_ = (uStack_978._4_4_ + 1.0) * uStack_b78._4_4_;
      uStack_d10._0_4_ = (float)uStack_b70 * 1.0;
      uStack_d10._4_4_ = uStack_b70._4_4_ * 1.0;
      auVar64 = _local_d20;
      uStack_d08._0_4_ = (float)uStack_b68 * 1.0;
      uStack_d08._4_4_ = 0x3f800000;
      auVar18 = _local_d20;
      local_1ea0 = local_d20;
      uStack_1e98 = uStack_d18;
      uStack_d10 = auVar64._16_8_;
      uStack_1e90 = uStack_d10;
      uStack_d08 = auVar18._24_8_;
      uStack_1e88 = uStack_d08;
      local_1ce0 = local_1df0;
      local_1d00 = local_d20;
      uStack_1cf8 = uStack_d18;
      uStack_1cf0 = uStack_d10;
      uStack_1ce8 = uStack_d08;
      auVar19._16_8_ = uStack_d10;
      auVar19._0_16_ = _local_d20;
      auVar19._24_8_ = uStack_d08;
      *(undefined1 (*) [32])*local_1df0 = auVar19;
      local_1df0 = (undefined1 (*) [64])(*local_1df0 + 0x20);
      _local_d20 = auVar18;
      _local_c80 = auVar20;
      local_c60 = auVar70;
      local_b80 = local_cc0._0_8_;
      uStack_b78 = local_cc0._8_8_;
      uStack_b70 = local_cc0._16_8_;
      uStack_b68 = local_cc0._24_8_;
      local_b20 = local_b40;
      uStack_b18 = uStack_b38;
      uStack_b10 = uStack_b30;
      uStack_b08 = uStack_b28;
      local_a58 = local_a78;
      local_a50 = local_a68;
      local_a40 = local_a78;
      local_a38 = local_a68;
      local_a28 = local_a78;
      local_a20 = local_a68;
      local_a10 = local_a78;
      local_a08 = local_a68;
      local_9f8 = local_a78;
      local_9f0 = local_a68;
      local_9d8 = local_a78;
      local_9d0 = local_a78;
      local_9b8 = local_a78;
      local_9a8 = local_9c0;
      local_980 = uVar21;
      uStack_978 = uVar23;
      local_960 = local_ca0._0_8_;
      uStack_958 = local_ca0._8_8_;
      uStack_950 = local_ca0._16_8_;
      uStack_948 = local_ca0._24_8_;
    }
    for (; local_1c68 = local_1d90, local_1e18 = local_1cb8, local_1e3c + 3 < local_1de4;
        local_1e3c = local_1e3c + 4) {
      local_1cd8 = local_1df0;
      local_390 = *(undefined8 *)*local_1df0;
      uStack_388 = *(undefined8 *)(*local_1df0 + 8);
      local_1c18 = local_1dc9;
      local_1c20 = &local_1eb0;
      local_410 = (undefined1  [16])0x0;
      local_4b0 = 0x3f800000;
      uStack_4ac = 0x3f800000;
      uStack_4a8 = 0x3f800000;
      uStack_4a4 = 0x3f800000;
      local_3a0 = 0x42b0c0a5;
      uStack_39c = 0x42b0c0a5;
      uStack_398 = 0x42b0c0a5;
      uStack_394 = 0x42b0c0a5;
      auVar16._8_4_ = 0x42b0c0a5;
      auVar16._0_8_ = 0x42b0c0a542b0c0a5;
      auVar16._12_4_ = 0x42b0c0a5;
      auVar22 = vminps_avx(*(undefined1 (*) [16])*local_1df0,auVar16);
      local_470._0_8_ = auVar22._0_8_;
      local_370 = local_470._0_8_;
      local_470._8_8_ = auVar22._8_8_;
      uStack_368 = local_470._8_8_;
      local_380 = 0xc2b0c0a5;
      uStack_37c = 0xc2b0c0a5;
      uStack_378 = 0xc2b0c0a5;
      uStack_374 = 0xc2b0c0a5;
      auVar17._8_4_ = 0xc2b0c0a5;
      auVar17._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar17._12_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar22,auVar17);
      local_470._0_8_ = auVar17._0_8_;
      uVar21 = local_470._0_8_;
      local_470._8_8_ = auVar17._8_8_;
      uVar23 = local_470._8_8_;
      local_3c0 = 0x3fb8aa3b;
      uStack_3bc = 0x3fb8aa3b;
      uStack_3b8 = 0x3fb8aa3b;
      uStack_3b4 = 0x3fb8aa3b;
      local_3b0._0_4_ = auVar17._0_4_;
      local_3b0._4_4_ = auVar17._4_4_;
      uStack_3a8._0_4_ = auVar17._8_4_;
      uStack_3a8._4_4_ = auVar17._12_4_;
      local_490._4_4_ = local_3b0._4_4_ * 1.442695;
      local_490._0_4_ = (float)local_3b0 * 1.442695;
      uStack_488._0_4_ = (float)uStack_3a8 * 1.442695;
      uStack_488._4_4_ = uStack_3a8._4_4_ * 1.442695;
      local_330 = local_490;
      uStack_328 = uStack_488;
      local_340 = 0x3f000000;
      uStack_33c = 0x3f000000;
      uStack_338 = 0x3f000000;
      uStack_334 = 0x3f000000;
      local_490._0_4_ = (float)local_3b0 * 1.442695 + 0.5;
      local_490._4_4_ = local_3b0._4_4_ * 1.442695 + 0.5;
      fVar71 = (float)uStack_3a8 * 1.442695 + 0.5;
      fVar72 = uStack_3a8._4_4_ * 1.442695 + 0.5;
      uStack_488._0_4_ = fVar71;
      uStack_488._4_4_ = fVar72;
      local_310 = local_490;
      uStack_308 = uStack_488;
      local_4a0._4_4_ = (int)(float)local_490._4_4_;
      local_4a0._0_4_ = (int)(float)local_490._0_4_;
      local_4a0._8_4_ = (int)fVar71;
      local_4a0._12_4_ = (int)fVar72;
      local_300 = local_4a0._0_8_;
      uStack_2f8 = local_4a0._8_8_;
      auVar52._8_8_ = local_4a0._8_8_;
      auVar52._0_8_ = local_4a0._0_8_;
      auVar16 = vcvtdq2ps_avx(auVar52);
      local_480 = auVar16._0_8_;
      local_2e0 = local_480;
      uStack_478 = auVar16._8_8_;
      uStack_2d8 = uStack_478;
      local_2f0 = local_490;
      uStack_2e8 = uStack_488;
      auVar53._8_8_ = uStack_488;
      auVar53._0_8_ = local_490;
      auVar22 = vcmpps_avx(auVar53,auVar16,1);
      local_4c0._0_8_ = auVar22._0_8_;
      local_440 = local_4c0._0_8_;
      local_4c0._8_8_ = auVar22._8_8_;
      uStack_438 = local_4c0._8_8_;
      local_450 = 0x3f8000003f800000;
      uStack_448 = 0x3f8000003f800000;
      auVar51._8_8_ = 0x3f8000003f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      local_4c0 = vpand_avx(auVar22,auVar51);
      local_420 = local_480;
      uStack_418 = uStack_478;
      local_430 = local_4c0._0_8_;
      uStack_428 = local_4c0._8_8_;
      _local_490 = vsubps_avx(auVar16,local_4c0);
      local_2c0 = local_490;
      local_2b0 = ::_ps_cephes_exp_C1;
      local_2d0 = local_470;
      local_1b0 = local_490;
      uStack_1a8 = uStack_488;
      local_1c0[0] = 0.6933594;
      local_1c0[1] = 0.6933594;
      afStack_1b8[0] = 0.6933594;
      afStack_1b8[1] = 0.6933594;
      local_1d0 = local_470._0_8_;
      uStack_1c8 = local_470._8_8_;
      auVar56._8_4_ = 0.6933594;
      auVar56._12_4_ = 0.6933594;
      auVar56._0_4_ = 0.6933594;
      auVar56._4_4_ = 0.6933594;
      auVar22 = vfnmadd213ps_fma(auVar56,_local_490,auVar17);
      local_2c8 = ::_ps_cephes_exp_C2;
      local_180 = local_490;
      uStack_178 = uStack_488;
      local_190[0] = -0.00021219444;
      local_190[1] = -0.00021219444;
      afStack_188[0] = -0.00021219444;
      afStack_188[1] = -0.00021219444;
      local_470._0_8_ = auVar22._0_8_;
      local_1a0 = local_470._0_8_;
      local_470._8_8_ = auVar22._8_8_;
      uStack_198 = local_470._8_8_;
      auVar57._8_4_ = -0.00021219444;
      auVar57._12_4_ = -0.00021219444;
      auVar57._0_4_ = -0.00021219444;
      auVar57._4_4_ = -0.00021219444;
      local_470 = vfnmadd213ps_fma(auVar57,_local_490,auVar22);
      local_3e0 = local_470._0_8_;
      uStack_3d8 = local_470._8_8_;
      local_3d0._0_4_ = local_470._0_4_;
      local_3d0._4_4_ = local_470._4_4_;
      uStack_3c8._0_4_ = local_470._8_4_;
      uStack_3c8._4_4_ = local_470._12_4_;
      local_480._4_4_ = local_3d0._4_4_ * local_3d0._4_4_;
      local_480._0_4_ = (float)local_3d0 * (float)local_3d0;
      uStack_478._0_4_ = (float)uStack_3c8 * (float)uStack_3c8;
      uStack_478._4_4_ = uStack_3c8._4_4_ * uStack_3c8._4_4_;
      uStack_4c8._0_4_ = 0x39506967;
      local_4d0 = (undefined1  [8])0x3950696739506967;
      uStack_4c8._4_4_ = 0x39506967;
      local_290 = local_4d0;
      local_228 = ::_ps_cephes_exp_p1;
      local_150 = 0x3950696739506967;
      uStack_148 = uStack_4c8;
      local_160 = local_470._0_8_;
      uStack_158 = local_470._8_8_;
      local_170[0] = 0.0013981999;
      local_170[1] = 0.0013981999;
      afStack_168[0] = 0.0013981999;
      afStack_168[1] = 0.0013981999;
      auVar58._8_4_ = 0.0013981999;
      auVar58._12_4_ = 0.0013981999;
      auVar58._0_4_ = 0.0013981999;
      auVar58._4_4_ = 0.0013981999;
      auVar22 = vfmadd213ps_fma(local_470,_local_4d0,auVar58);
      local_240 = ::_ps_cephes_exp_p2;
      local_4d0 = auVar22._0_8_;
      local_120 = local_4d0;
      uStack_4c8 = auVar22._8_8_;
      uStack_118 = uStack_4c8;
      local_130 = local_470._0_8_;
      uStack_128 = local_470._8_8_;
      local_140[0] = 0.008333452;
      local_140[1] = 0.008333452;
      afStack_138[0] = 0.008333452;
      afStack_138[1] = 0.008333452;
      auVar59._8_4_ = 0.008333452;
      auVar59._12_4_ = 0.008333452;
      auVar59._0_4_ = 0.008333452;
      auVar59._4_4_ = 0.008333452;
      auVar22 = vfmadd213ps_fma(local_470,auVar22,auVar59);
      local_258 = ::_ps_cephes_exp_p3;
      local_4d0 = auVar22._0_8_;
      local_f0 = local_4d0;
      uStack_4c8 = auVar22._8_8_;
      uStack_e8 = uStack_4c8;
      local_100 = local_470._0_8_;
      uStack_f8 = local_470._8_8_;
      local_110[0] = 0.041665796;
      local_110[1] = 0.041665796;
      afStack_108[0] = 0.041665796;
      afStack_108[1] = 0.041665796;
      auVar60._8_4_ = 0.041665796;
      auVar60._12_4_ = 0.041665796;
      auVar60._0_4_ = 0.041665796;
      auVar60._4_4_ = 0.041665796;
      auVar22 = vfmadd213ps_fma(local_470,auVar22,auVar60);
      local_270 = ::_ps_cephes_exp_p4;
      local_4d0 = auVar22._0_8_;
      local_c0 = local_4d0;
      uStack_4c8 = auVar22._8_8_;
      uStack_b8 = uStack_4c8;
      local_d0 = local_470._0_8_;
      uStack_c8 = local_470._8_8_;
      local_e0[0] = 0.16666666;
      local_e0[1] = 0.16666666;
      afStack_d8[0] = 0.16666666;
      afStack_d8[1] = 0.16666666;
      auVar61._8_4_ = 0.16666666;
      auVar61._12_4_ = 0.16666666;
      auVar61._0_4_ = 0.16666666;
      auVar61._4_4_ = 0.16666666;
      auVar22 = vfmadd213ps_fma(local_470,auVar22,auVar61);
      local_288 = ::_ps_cephes_exp_p5;
      local_4d0 = auVar22._0_8_;
      local_90 = local_4d0;
      uStack_4c8 = auVar22._8_8_;
      uStack_88 = uStack_4c8;
      local_a0 = local_470._0_8_;
      uStack_98 = local_470._8_8_;
      local_b0[0] = 0.5;
      local_b0[1] = 0.5;
      afStack_a8[0] = 0.5;
      afStack_a8[1] = 0.5;
      auVar62._8_4_ = 0.5;
      auVar62._12_4_ = 0.5;
      auVar62._0_4_ = 0.5;
      auVar62._4_4_ = 0.5;
      auVar22 = vfmadd213ps_fma(local_470,auVar22,auVar62);
      local_298 = local_480;
      local_4d0 = auVar22._0_8_;
      local_60 = local_4d0;
      uStack_4c8 = auVar22._8_8_;
      uStack_58 = uStack_4c8;
      local_70 = local_480;
      uStack_68 = uStack_478;
      local_80 = local_470._0_8_;
      uStack_78 = local_470._8_8_;
      auVar22 = vfmadd213ps_fma(_local_480,auVar22,local_470);
      local_4d0 = auVar22._0_8_;
      uVar24 = local_4d0;
      uStack_4c8 = auVar22._8_8_;
      uVar25 = uStack_4c8;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      local_350._0_4_ = auVar22._0_4_;
      local_350._4_4_ = auVar22._4_4_;
      uStack_348._0_4_ = auVar22._8_4_;
      uStack_348._4_4_ = auVar22._12_4_;
      local_4d0._4_4_ = local_350._4_4_ + 1.0;
      local_4d0._0_4_ = (float)local_350 + 1.0;
      uStack_4c8._0_4_ = (float)uStack_348 + 1.0;
      uStack_4c8._4_4_ = uStack_348._4_4_ + 1.0;
      local_320._0_4_ = local_490._0_4_;
      local_320._4_4_ = local_490._4_4_;
      uStack_318._0_4_ = local_490._8_4_;
      uStack_318._4_4_ = local_490._12_4_;
      local_4a0._4_4_ = (int)local_320._4_4_;
      local_4a0._0_4_ = (int)(float)local_320;
      local_4a0._8_4_ = (int)(float)uStack_318;
      local_4a0._12_4_ = (int)uStack_318._4_4_;
      local_200 = local_4a0._0_8_;
      uStack_1f8 = local_4a0._8_8_;
      local_210 = 0x7f0000007f;
      uStack_208 = 0x7f0000007f;
      auVar55._8_8_ = local_4a0._8_8_;
      auVar55._0_8_ = local_4a0._0_8_;
      auVar54._8_8_ = 0x7f0000007f;
      auVar54._0_8_ = 0x7f0000007f;
      auVar22 = vpaddd_avx(auVar55,auVar54);
      local_4a0._0_8_ = auVar22._0_8_;
      local_1e0 = local_4a0._0_8_;
      local_4a0._8_8_ = auVar22._8_8_;
      uStack_1d8 = local_4a0._8_8_;
      local_1e4 = 0x17;
      local_4a0 = vpslld_avx(auVar22,ZEXT416(0x17));
      local_460 = local_4a0._0_8_;
      uStack_458 = local_4a0._8_8_;
      local_4e0 = local_4a0._0_8_;
      uStack_4d8 = local_4a0._8_8_;
      local_3f0 = _local_4d0;
      local_400._0_4_ = local_4a0._0_4_;
      local_400._4_4_ = local_4a0._4_4_;
      uStack_3f8._0_4_ = local_4a0._8_4_;
      uStack_3f8._4_4_ = local_4a0._12_4_;
      local_4d0._4_4_ = (local_350._4_4_ + 1.0) * local_400._4_4_;
      local_4d0._0_4_ = ((float)local_350 + 1.0) * (float)local_400;
      uStack_4c8._0_4_ = ((float)uStack_348 + 1.0) * (float)uStack_3f8;
      uStack_4c8._4_4_ = (uStack_348._4_4_ + 1.0) * uStack_3f8._4_4_;
      local_1eb0 = local_4d0;
      uStack_1ea8 = uStack_4c8;
      local_1cc0 = local_1df0;
      local_1cd0 = local_4d0;
      uStack_1cc8 = uStack_4c8;
      auVar22._8_8_ = uStack_4c8;
      auVar22._0_8_ = local_4d0;
      *(undefined1 (*) [16])*local_1df0 = auVar22;
      local_1df0 = (undefined1 (*) [64])(*local_1df0 + 0x10);
      local_400 = local_4a0._0_8_;
      uStack_3f8 = local_4a0._8_8_;
      local_3d0 = local_3e0;
      uStack_3c8 = uStack_3d8;
      local_3b0 = uVar21;
      uStack_3a8 = uVar23;
      local_350 = uVar24;
      uStack_348 = uVar25;
      local_320 = local_490;
      uStack_318 = uStack_488;
      local_2b8 = local_2d0;
      local_2a8 = local_2c0;
      local_2a0 = local_2d0;
      local_280 = local_2d0;
      local_278 = local_290;
      local_268 = local_2d0;
      local_260 = local_290;
      local_250 = local_2d0;
      local_248 = local_290;
      local_238 = local_2d0;
      local_230 = local_290;
      local_220 = local_2d0;
      local_218 = local_290;
    }
    for (; local_1e3c < local_1de4; local_1e3c = local_1e3c + 1) {
      local_1c08 = local_1dc9;
      local_1c10 = local_1df0;
      fVar71 = expf(*(float *)*local_1df0);
      *(float *)*local_1df0 = fVar71;
      local_1df0 = (undefined1 (*) [64])(*local_1df0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}